

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_function_primitive_adoptDefinitionOf
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong *puVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t *psVar3;
  sysbvm_tuple_t *psVar4;
  uint uVar5;
  ulong uVar6;
  sysbvm_tuple_t sVar7;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  puVar1 = (ulong *)*arguments;
  if (((ulong)puVar1 & 0xf) == 0 && puVar1 != (ulong *)0x0) {
    uVar6 = *puVar1;
    if (((uVar6 & 0xf) == 0 && uVar6 != 0) && ((*(byte *)(uVar6 + 8) & 0x80) == 0)) {
      uVar6 = *(ulong *)(uVar6 + 0x70);
      if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
        uVar5 = (uint)((long)uVar6 >> 4);
      }
      else {
        uVar5 = (uint)*(undefined8 *)(uVar6 + 0x10);
      }
    }
    else {
      uVar5 = 0;
    }
    if ((uVar5 >> 0xc & 1) == 0) goto LAB_0011d0da;
  }
  else {
LAB_0011d0da:
    sysbvm_error("Expected a function.");
  }
  puVar1 = (ulong *)arguments[1];
  if (((ulong)puVar1 & 0xf) == 0 && puVar1 != (ulong *)0x0) {
    uVar6 = *puVar1;
    if (((uVar6 & 0xf) == 0 && uVar6 != 0) && ((*(byte *)(uVar6 + 8) & 0x80) == 0)) {
      uVar6 = *(ulong *)(uVar6 + 0x70);
      if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
        uVar5 = (uint)((long)uVar6 >> 4);
      }
      else {
        uVar5 = (uint)*(undefined8 *)(uVar6 + 0x10);
      }
    }
    else {
      uVar5 = 0;
    }
    if ((uVar5 >> 0xc & 1) == 0) goto LAB_0011d136;
  }
  else {
LAB_0011d136:
    sysbvm_error("Expected a function.");
  }
  sVar7 = *arguments;
  sVar2 = arguments[1];
  *(undefined8 *)(sVar7 + 0x48) = *(undefined8 *)(sVar2 + 0x48);
  *(undefined8 *)(sVar7 + 0x38) = *(undefined8 *)(sVar2 + 0x38);
  *(undefined8 *)(sVar7 + 0x40) = *(undefined8 *)(sVar2 + 0x40);
  puVar1 = (ulong *)*arguments;
  if (((ulong)puVar1 & 0xf) == 0 && puVar1 != (ulong *)0x0) {
    uVar6 = *puVar1;
    if (((uVar6 & 0xf) == 0 && uVar6 != 0) && ((*(byte *)(uVar6 + 8) & 0x80) == 0)) {
      uVar6 = *(ulong *)(uVar6 + 0x70);
      if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
        uVar5 = (uint)((long)uVar6 >> 4);
      }
      else {
        uVar5 = (uint)*(undefined8 *)(uVar6 + 0x10);
      }
    }
    else {
      uVar5 = 0;
    }
    if ((uVar5 >> 0xc & 1) != 0) {
      uVar6 = puVar1[5];
      if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
        uVar6 = (long)uVar6 >> 4;
      }
      else {
        uVar6 = *(ulong *)(uVar6 + 0x10);
      }
      goto LAB_0011d1bd;
    }
  }
  uVar6 = 0;
LAB_0011d1bd:
  if ((uVar6 & 4) == 0) {
    sVar7 = *arguments;
    *(undefined8 *)(sVar7 + 0x28) = *(undefined8 *)(sVar2 + 0x28);
    *(undefined8 *)(sVar7 + 0x58) = *(undefined8 *)(sVar2 + 0x58);
    *(undefined8 *)(sVar7 + 0x50) = *(undefined8 *)(sVar2 + 0x50);
    *(undefined8 *)(sVar7 + 0x68) = *(undefined8 *)(sVar2 + 0x68);
  }
  else {
    sVar7 = *arguments;
    uVar6 = *(ulong *)(sVar7 + 0x28);
    if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
      uVar5 = (uint)((long)uVar6 >> 4);
    }
    else {
      uVar5 = (uint)*(undefined8 *)(uVar6 + 0x10);
    }
    uVar6 = *(ulong *)(sVar2 + 0x28);
    if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
      uVar6 = (long)uVar6 >> 4;
    }
    else {
      uVar6 = *(ulong *)(uVar6 + 0x10);
    }
    *(ulong *)(sVar7 + 0x28) = (uVar6 | uVar5 & 0x8001c) << 4 | 0xb;
    if (*(long *)(sVar2 + 0x58) != 0) {
      *(long *)(sVar7 + 0x58) = *(long *)(sVar2 + 0x58);
    }
  }
  sVar7 = *arguments;
  if ((*(sysbvm_tuple_t *)(sVar7 + 0x18) != 0) || (*(long *)(sVar7 + 0x10) != 0)) {
    sysbvm_programEntity_recordBindingWithOwnerAndName
              (context,*(sysbvm_tuple_t *)(sVar7 + 0x48),*(sysbvm_tuple_t *)(sVar7 + 0x18),
               *(sysbvm_tuple_t *)(sVar7 + 0x10));
  }
  psVar3 = (sysbvm_tuple_t *)*arguments;
  psVar4 = (sysbvm_tuple_t *)arguments[1];
  uVar6 = (ulong)psVar4 & 0xf;
  if (uVar6 == 0 && psVar4 != (sysbvm_tuple_t *)0x0) {
    sVar7 = *psVar4;
  }
  else if ((int)uVar6 == 0xf) {
    sVar7 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar4 >> 4);
  }
  else {
    sVar7 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar6);
  }
  *psVar3 = sVar7;
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_adoptDefinitionOf(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    sysbvm_tuple_t *definitionFunction = &arguments[1];
    if(!sysbvm_tuple_isFunction(context, *function)) sysbvm_error("Expected a function.");
    if(!sysbvm_tuple_isFunction(context, *definitionFunction)) sysbvm_error("Expected a function.");
    
    sysbvm_function_t **functionObject = (sysbvm_function_t**)function;
    sysbvm_function_t **definitionFunctionObject = (sysbvm_function_t**)definitionFunction;

    (*functionObject)->definition = (*definitionFunctionObject)->definition;
    (*functionObject)->captureVector = (*definitionFunctionObject)->captureVector;
    (*functionObject)->captureEnvironment = (*definitionFunctionObject)->captureEnvironment;
    bool isCorePrimitive = sysbvm_function_isCorePrimitive(context, *function);
    if(isCorePrimitive)
    {
        (*functionObject)->flags = sysbvm_tuple_bitflags_encode(
            (sysbvm_tuple_bitflags_decode((*functionObject)->flags) & SYSBVM_FUNCTION_FLAGS_BOOTSTRAP_PRIMITIVE_KEPT_FLAGS)
            | sysbvm_tuple_bitflags_decode((*definitionFunctionObject)->flags)
        );

        if((*definitionFunctionObject)->primitiveName)
            (*functionObject)->primitiveName = (*definitionFunctionObject)->primitiveName;
    }
    else
    {
        (*functionObject)->flags = (*definitionFunctionObject)->flags;
        (*functionObject)->primitiveName = (*definitionFunctionObject)->primitiveName;
        (*functionObject)->primitiveTableIndex = (*definitionFunctionObject)->primitiveTableIndex;
        (*functionObject)->annotations = (*definitionFunctionObject)->annotations;
    }

    if((*functionObject)->super.owner || (*functionObject)->super.name)
        sysbvm_programEntity_recordBindingWithOwnerAndName(context, (*functionObject)->definition, (*functionObject)->super.owner, (*functionObject)->super.name);
    sysbvm_tuple_setType((sysbvm_object_tuple_t*)*functionObject, sysbvm_tuple_getType(context, (sysbvm_tuple_t)*definitionFunctionObject));
    return SYSBVM_VOID_TUPLE;
}